

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_graph.cc
# Opt level: O0

void GraphTask::add_edge_features_group_fn(task_data *D,float fv,uint64_t fx)

{
  float fVar1;
  ulong uVar2;
  ulong in_RSI;
  long in_RDI;
  size_t k;
  uint64_t fx2;
  example *node;
  ulong i;
  features *this;
  
  this = *(features **)(in_RDI + 0x90);
  uVar2 = in_RSI / *(ulong *)(in_RDI + 0x28);
  for (i = 0; i < *(ulong *)(in_RDI + 0x10); i = i + 1) {
    fVar1 = *(float *)(*(long *)(in_RDI + 0x98) + i * 4);
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      features::push_back(this,(feature_value)(uVar2 >> 0x20),i);
    }
  }
  return;
}

Assistant:

void add_edge_features_group_fn(task_data& D, float fv, uint64_t fx)
{
  example* node = D.cur_node;
  uint64_t fx2 = fx / (uint64_t)D.multiplier;
  for (size_t k = 0; k < D.numN; k++)
  {
    if (D.neighbor_predictions[k] == 0.)
      continue;
    node->feature_space[neighbor_namespace].push_back(
        fv * D.neighbor_predictions[k], (uint64_t)((fx2 + 348919043 * k) * D.multiplier) & (uint64_t)D.mask);
  }
}